

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  int iVar4;
  ulong uVar5;
  long lVar6;
  Mat src;
  void *ptr;
  uchar *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = CONCAT44(in_register_0000008c,target_stride);
  local_38 = CONCAT44(in_register_00000084,target_height);
  iVar3 = this->w;
  iVar4 = this->h;
  if (iVar4 == target_height && iVar3 == target_width) {
    to_pixels(this,pixels,type);
    return;
  }
  uVar2 = type & 0xffff;
  if (0xffff < (uint)type) {
    uVar2 = type >> 0x10;
  }
  local_48 = pixels;
  if (uVar2 - 1 < 2) {
    src.data = (void *)0x0;
    piVar1 = (int *)0x0;
    if (iVar4 * iVar3 != 0) {
      uVar5 = (long)(iVar4 * iVar3) * 3 + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      iVar3 = posix_memalign(&ptr,0x10,uVar5 + 4);
      if (iVar3 != 0) {
        ptr = (void *)0x0;
      }
      src.data = ptr;
      piVar1 = (int *)((long)ptr + uVar5);
      *(undefined4 *)((long)ptr + uVar5) = 1;
    }
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c3((uchar *)src.data,this->w,this->h,this->w * 3,local_48,target_width,
                       (int)local_38,(int)local_40);
    if (piVar1 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    iVar3 = *piVar1;
    UNLOCK();
  }
  else if (uVar2 == 4) {
    src.data = (void *)0x0;
    piVar1 = (int *)0x0;
    iVar4 = iVar4 * iVar3;
    if (iVar4 != 0) {
      lVar6 = (long)iVar4 * 4;
      ptr = (void *)0x0;
      iVar3 = posix_memalign(&ptr,0x10,(long)iVar4 * 4 + 4);
      if (iVar3 != 0) {
        ptr = (void *)0x0;
      }
      src.data = ptr;
      piVar1 = (int *)((long)ptr + lVar6);
      *(undefined4 *)((long)ptr + lVar6) = 1;
    }
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c4((uchar *)src.data,this->w,this->h,this->w * 4,local_48,target_width,
                       (int)local_38,(int)local_40);
    if (piVar1 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    iVar3 = *piVar1;
    UNLOCK();
  }
  else {
    if (uVar2 != 3) {
      return;
    }
    src.data = (void *)0x0;
    piVar1 = (int *)0x0;
    if (iVar4 * iVar3 != 0) {
      uVar5 = (long)(iVar4 * iVar3) + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      iVar3 = posix_memalign(&ptr,0x10,uVar5 + 4);
      if (iVar3 != 0) {
        ptr = (void *)0x0;
      }
      src.data = ptr;
      piVar1 = (int *)((long)ptr + uVar5);
      *(undefined4 *)((long)ptr + uVar5) = 1;
    }
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c1((uchar *)src.data,this->w,this->h,this->w,local_48,target_width,(int)local_38
                       ,(int)local_40);
    if (piVar1 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    iVar3 = *piVar1;
    UNLOCK();
  }
  if ((iVar3 == 0) && (src.data != (void *)0x0)) {
    free(src.data);
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}